

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_push(iterator *this,iter_result *e,read_critical_section *rcs)

{
  bool bVar1;
  stack_entry local_28;
  
  local_28.super_iter_result.node.tagged_ptr = (e->node).tagged_ptr;
  if ((local_28.super_iter_result.node.tagged_ptr & 7) != 0) {
    bVar1 = try_push(this,(olc_node_ptr)local_28.super_iter_result.node.tagged_ptr,e->key_byte,
                     e->child_index,e->prefix,rcs);
    return bVar1;
  }
  local_28.super_iter_result.key_byte = 0xff;
  local_28.super_iter_result.child_index = 0xff;
  local_28.super_iter_result.prefix.u64 = 0;
  local_28.version = (rcs->version).version;
  std::
  deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
  ::
  emplace_back<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
            ((deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
              *)&this->stack_,&local_28);
  return true;
}

Assistant:

bool try_push(const typename inode_base::iter_result& e,
                  const optimistic_lock::read_critical_section& rcs) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        return try_push_leaf(e.node, rcs);
      }
      return try_push(e.node, e.key_byte, e.child_index, e.prefix, rcs);
    }